

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O1

int i2c_ASN1_INTEGER(ASN1_INTEGER *a,uchar **pp)

{
  uchar uVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  uint8_t msb;
  CBS cbs;
  CBS copy;
  byte local_49;
  CBS local_48;
  CBS local_38;
  
  if (a == (ASN1_INTEGER *)0x0) {
    return 0;
  }
  local_48.data = a->data;
  local_48.len = (size_t)a->length;
  if (local_48.len != 0) {
    do {
      if (*local_48.data != '\0') break;
      CBS_skip(&local_48,1);
    } while (local_48.len != 0);
  }
  uVar7 = a->type;
  local_38.data = local_48.data;
  local_38.len = local_48.len;
  iVar3 = CBS_get_u8(&local_38,&local_49);
  uVar6 = 1;
  bVar8 = true;
  if (iVar3 != 0) {
    if ((uVar7 >> 8 & 1) == 0) {
      uVar6 = (ulong)(local_49 >> 7);
    }
    else {
      if (local_49 < 0x81) {
        if (local_49 != 0x80) {
          bVar8 = false;
          uVar6 = 0;
          goto LAB_00208f94;
        }
        bVar8 = local_38.len == 0;
        if ((!bVar8) && (*local_38.data == '\0')) {
          uVar6 = 1;
          do {
            uVar4 = uVar6;
            if (local_38.len == uVar4) break;
            uVar6 = uVar4 + 1;
          } while (local_38.data[uVar4] == '\0');
          bVar8 = local_38.len <= uVar4;
        }
        uVar6 = (ulong)(bVar8 ^ 1);
      }
      bVar8 = false;
    }
  }
LAB_00208f94:
  if ((uVar6 ^ 0x7fffffff) < local_48.len) {
    uVar7 = 0;
    ERR_put_error(0xc,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x7e);
  }
  else {
    uVar7 = (uint)(local_48.len + uVar6);
    if ((int)uVar7 < 1) {
      __assert_fail("len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0x82,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
    }
    if (pp != (uchar **)0x0) {
      if (uVar6 != 0) {
        **pp = '\0';
      }
      if (local_48.len != 0) {
        memcpy(*pp + uVar6,local_48.data,local_48.len);
      }
      puVar2 = *pp;
      if (bVar8) {
        if ((char)*puVar2 < '\0') {
          __assert_fail("(*outp)[0] < 0x80",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                        ,0x8f,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
        }
      }
      else {
        uVar6 = local_48.len + uVar6 & 0x7fffffff;
        if (uVar6 != 0) {
          uVar4 = uVar6 - 1;
          bVar5 = 0;
          do {
            uVar1 = puVar2[uVar4];
            puVar2[uVar4] = -(bVar5 + uVar1);
            bVar5 = uVar1 != '\0' | bVar5;
            uVar4 = uVar4 - 1;
          } while (uVar4 < uVar6);
        }
        if (-1 < (char)**pp) {
          __assert_fail("(*outp)[0] >= 0x80",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                        ,0x8d,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
        }
      }
      *pp = *pp + (uVar7 & 0x7fffffff);
    }
  }
  return uVar7;
}

Assistant:

int i2c_ASN1_INTEGER(const ASN1_INTEGER *in, unsigned char **outp) {
  if (in == NULL) {
    return 0;
  }

  // |ASN1_INTEGER|s should be represented minimally, but it is possible to
  // construct invalid ones. Skip leading zeros so this does not produce an
  // invalid encoding or break invariants.
  CBS cbs;
  CBS_init(&cbs, in->data, in->length);
  while (CBS_len(&cbs) > 0 && CBS_data(&cbs)[0] == 0) {
    CBS_skip(&cbs, 1);
  }

  int is_negative = (in->type & V_ASN1_NEG) != 0;
  size_t pad;
  CBS copy = cbs;
  uint8_t msb;
  if (!CBS_get_u8(&copy, &msb)) {
    // Zero is represented as a single byte.
    is_negative = 0;
    pad = 1;
  } else if (is_negative) {
    // 0x80...01 through 0xff...ff have a two's complement of 0x7f...ff
    // through 0x00...01 and need an extra byte to be negative.
    // 0x01...00 through 0x80...00 have a two's complement of 0xfe...ff
    // through 0x80...00 and can be negated as-is.
    pad = msb > 0x80 ||
          (msb == 0x80 && !is_all_zeros(CBS_data(&copy), CBS_len(&copy)));
  } else {
    // If the high bit is set, the signed representation needs an extra
    // byte to be positive.
    pad = (msb & 0x80) != 0;
  }

  if (CBS_len(&cbs) > INT_MAX - pad) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }
  int len = (int)(pad + CBS_len(&cbs));
  assert(len > 0);
  if (outp == NULL) {
    return len;
  }

  if (pad) {
    (*outp)[0] = 0;
  }
  OPENSSL_memcpy(*outp + pad, CBS_data(&cbs), CBS_len(&cbs));
  if (is_negative) {
    negate_twos_complement(*outp, len);
    assert((*outp)[0] >= 0x80);
  } else {
    assert((*outp)[0] < 0x80);
  }
  *outp += len;
  return len;
}